

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O0

void __thiscall
miniros::ServiceManager::start
          (ServiceManager *this,PollManagerPtr *pm,MasterLinkPtr *master_link,
          ConnectionManagerPtr *cm,XMLRPCManagerPtr *rpcm)

{
  shared_ptr<miniros::ConnectionManager> *in_RDX;
  long in_RDI;
  shared_ptr<miniros::ConnectionManager> *in_stack_ffffffffffffffa8;
  
  *(undefined1 *)(in_RDI + 0x80) = 0;
  std::shared_ptr<miniros::MasterLink>::operator=
            ((shared_ptr<miniros::MasterLink> *)in_RDX,
             (shared_ptr<miniros::MasterLink> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<miniros::PollManager>::operator=
            ((shared_ptr<miniros::PollManager> *)in_RDX,
             (shared_ptr<miniros::PollManager> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<miniros::ConnectionManager>::operator=(in_RDX,in_stack_ffffffffffffffa8);
  std::shared_ptr<miniros::RPCManager>::operator=
            ((shared_ptr<miniros::RPCManager> *)in_RDX,
             (shared_ptr<miniros::RPCManager> *)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void ServiceManager::start(PollManagerPtr pm, MasterLinkPtr master_link, ConnectionManagerPtr cm, XMLRPCManagerPtr rpcm)
{
  shutting_down_ = false;

  master_link_ = master_link;
  poll_manager_ = pm;
  connection_manager_ = cm;
  xmlrpc_manager_ = rpcm;
}